

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool findKeyPresses<short>
               (TWaveformViewT<short> *waveform,TKeyPressCollectionT<short> *res,
               TWaveformT<short> *waveformThreshold,TWaveformT<short> *waveformMax,
               double thresholdBackground,int historySize,int historySizeReset,bool removeLowPower)

{
  value_type vVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  short sVar5;
  int iVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  size_type *psVar10;
  reference pvVar11;
  reference pvVar12;
  stKeyPressCollection<short> *in_RCX;
  vector<short,_std::allocator<short>_> *in_RDX;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  byte in_stack_00000008;
  int i_2;
  TKeyPressCollectionT<short> res2;
  stKeyPressData<short> *kp_1;
  iterator __end0_1;
  iterator __begin0_1;
  type *__range3_1;
  type tmp;
  stKeyPressData<short> *kp;
  iterator __end0;
  iterator __begin0;
  TKeyPressCollectionT<short> *__range3;
  double avgPower;
  size_type oldn;
  double acur_1;
  int64_t itest;
  double acur;
  int64_t ii;
  int64_t i_1;
  int64_t i;
  TWaveformT<short> waveformAbs;
  int64_t n;
  short *samples;
  deque<long,_std::allocator<long>_> que;
  int k;
  vector<double,_std::allocator<double>_> rbSamples;
  double rbAverage;
  int rbBegin;
  stKeyPressCollection<short> *in_stack_fffffffffffffd28;
  stKeyPressCollection<short> *this;
  stKeyPressCollection<short> *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  allocator_type *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  deque<long,_std::allocator<long>_> *in_stack_fffffffffffffd50;
  stKeyPressCollection<short> *__a;
  deque<long,_std::allocator<long>_> *in_stack_fffffffffffffd80;
  int local_204;
  stKeyPressCollection<short> local_200;
  int local_1dc;
  reference local_1d8;
  stKeyPressData<short> *local_1d0;
  __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
  local_1c8;
  undefined1 *local_1c0;
  undefined1 local_1b8 [32];
  reference local_198;
  stKeyPressData<short> *local_190;
  __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
  local_188;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *local_180;
  double local_178;
  size_type local_170;
  long local_168;
  long lStack_160;
  size_type local_158;
  undefined8 local_150;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  double local_130;
  size_type local_128;
  double local_120;
  long local_118;
  size_type local_110;
  size_type local_108;
  vector<short,_std::allocator<short>_> local_f8;
  long local_e0;
  long local_d8;
  int local_78;
  undefined8 local_60;
  deque<long,_std::allocator<long>_> local_58;
  long *local_8;
  
  local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_cur = (_Elt_pointer)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last._7_1_ = in_stack_00000008 & 1;
  local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node._0_4_ = in_R9D;
  local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node._4_4_ = in_R8D;
  local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_first = (_Elt_pointer)in_RCX;
  local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_last = (_Elt_pointer)in_RDX;
  local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)in_RSI;
  local_8 = in_RDI;
  std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::clear
            ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)0x1bcd4d);
  std::vector<short,_std::allocator<short>_>::resize
            ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffd50,
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  std::vector<short,_std::allocator<short>_>::resize
            ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffd50,
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last._0_4_ = 0;
  local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  local_60 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x1bcdcb);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd50,
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
             (value_type_conflict4 *)in_stack_fffffffffffffd40,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  std::allocator<double>::~allocator((allocator<double> *)0x1bcdff);
  local_78 = local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_node._4_4_;
  std::allocator<long>::allocator((allocator<long> *)0x1bce32);
  std::deque<long,_std::allocator<long>_>::deque
            (in_stack_fffffffffffffd50,CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
             ,(allocator_type *)in_stack_fffffffffffffd40);
  std::allocator<long>::~allocator((allocator<long> *)0x1bce5e);
  local_d8 = *local_8;
  local_e0 = local_8[1];
  std::allocator<short>::allocator((allocator<short> *)0x1bceaa);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffd50,
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),in_stack_fffffffffffffd40
            );
  std::allocator<short>::~allocator((allocator<short> *)0x1bced6);
  for (local_108 = 0; (long)local_108 < local_e0; local_108 = local_108 + 1) {
    sVar5 = *(short *)(local_d8 + local_108 * 2);
    if (sVar5 < 1) {
      sVar5 = -sVar5;
    }
    pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](&local_f8,local_108);
    *pvVar7 = sVar5;
  }
  for (local_110 = 0; (long)local_110 < local_e0; local_110 = local_110 + 1) {
    local_118 = local_110 - (long)(local_78 / 2);
    if (-1 < local_118) {
      in_stack_fffffffffffffd80 = &local_58;
      sVar8 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80);
      auVar13._8_4_ = (int)(sVar8 >> 0x20);
      auVar13._0_8_ = sVar8;
      auVar13._12_4_ = 0x45300000;
      local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
      _M_start._M_first =
           (_Elt_pointer)
           ((double)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                    super__Deque_impl_data._M_start._M_first *
           ((auVar13._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0)));
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80,
                          (long)(int)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl
                                     .super__Deque_impl_data._M_start._M_last);
      local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
      _M_start._M_first =
           (_Elt_pointer)
           ((double)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                    super__Deque_impl_data._M_start._M_first - *pvVar9);
      pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](&local_f8,local_110);
      sVar5 = *pvVar7;
      local_120 = (double)(int)sVar5;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80,
                          (long)(int)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl
                                     .super__Deque_impl_data._M_start._M_last);
      *pvVar9 = (double)(int)sVar5;
      local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
      _M_start._M_first =
           (_Elt_pointer)
           ((double)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                    super__Deque_impl_data._M_start._M_first + local_120);
      sVar8 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80);
      auVar14._8_4_ = (int)(sVar8 >> 0x20);
      auVar14._0_8_ = sVar8;
      auVar14._12_4_ = 0x45300000;
      local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
      _M_start._M_first =
           (_Elt_pointer)
           ((double)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                    super__Deque_impl_data._M_start._M_first /
           ((auVar14._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0)));
      iVar6 = (int)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                   super__Deque_impl_data._M_start._M_last + 1;
      local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
      _M_start._M_last._0_4_ = iVar6;
      sVar8 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)&local_58);
      if ((int)sVar8 <= iVar6) {
        local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
        _M_start._M_last._0_4_ = 0;
      }
    }
    if ((long)local_110 < (long)local_78) {
      while( true ) {
        bVar3 = std::deque<long,_std::allocator<long>_>::empty
                          ((deque<long,_std::allocator<long>_> *)0x1bd1c9);
        bVar4 = false;
        if (!bVar3) {
          pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](&local_f8,local_110);
          sVar5 = *pvVar7;
          psVar10 = (size_type *)
                    std::deque<long,_std::allocator<long>_>::back
                              ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd40);
          pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](&local_f8,*psVar10);
          bVar4 = *pvVar7 <= sVar5;
        }
        if (!bVar4) break;
        std::deque<long,_std::allocator<long>_>::pop_back
                  ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd30);
      }
      std::deque<long,_std::allocator<long>_>::push_back
                ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd30,
                 (value_type_conflict5 *)in_stack_fffffffffffffd28);
    }
    else {
      while( true ) {
        bVar3 = std::deque<long,_std::allocator<long>_>::empty
                          ((deque<long,_std::allocator<long>_> *)0x1bd27f);
        bVar4 = false;
        if (!bVar3) {
          pvVar11 = std::deque<long,_std::allocator<long>_>::front
                              ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd40);
          bVar4 = *pvVar11 <= (long)(local_110 - (long)local_78);
        }
        if (!bVar4) break;
        std::deque<long,_std::allocator<long>_>::pop_front
                  ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd30);
      }
      while( true ) {
        bVar3 = std::deque<long,_std::allocator<long>_>::empty
                          ((deque<long,_std::allocator<long>_> *)0x1bd2e1);
        bVar4 = false;
        if (!bVar3) {
          pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](&local_f8,local_110);
          sVar5 = *pvVar7;
          psVar10 = (size_type *)
                    std::deque<long,_std::allocator<long>_>::back
                              ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd40);
          pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](&local_f8,*psVar10);
          bVar4 = *pvVar7 <= sVar5;
        }
        if (!bVar4) break;
        std::deque<long,_std::allocator<long>_>::pop_back
                  ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd30);
      }
      std::deque<long,_std::allocator<long>_>::push_back
                ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd30,
                 (value_type_conflict5 *)in_stack_fffffffffffffd28);
      local_128 = local_110 - (long)(local_78 / 2);
      if ((((long)(local_78 << 1) <= (long)local_128) &&
          ((long)local_128 < local_e0 - (local_78 << 1))) &&
         (psVar10 = (size_type *)
                    std::deque<long,_std::allocator<long>_>::front
                              ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd40),
         *psVar10 == local_128)) {
        pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](&local_f8,local_128);
        local_130 = (double)(int)*pvVar7;
        if ((double)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur *
            (double)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                    super__Deque_impl_data._M_start._M_first < local_130) {
          local_168 = *local_8;
          lStack_160 = local_8[1];
          local_158 = local_128;
          local_150 = 0;
          local_148 = 0xffffffff;
          local_144 = 0xffffffff;
          local_140 = 0x3f;
          std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>::
          emplace_back<stKeyPressData<short>>
                    ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                     in_stack_fffffffffffffd40,
                     (stKeyPressData<short> *)
                     CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        }
      }
      dVar2 = (double)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur *
              (double)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                      super__Deque_impl_data._M_start._M_first;
      pvVar7 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)
                          local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_last,local_128);
      *pvVar7 = (value_type)(int)dVar2;
      psVar10 = (size_type *)
                std::deque<long,_std::allocator<long>_>::front
                          ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd40);
      pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](&local_f8,*psVar10);
      vVar1 = *pvVar7;
      pvVar7 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)
                          local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_first,local_128);
      *pvVar7 = vVar1;
    }
  }
  if ((local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last._7_1_ & 1) != 0) {
    do {
      local_170 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                            ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                              *)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_node);
      local_178 = 0.0;
      local_180 = (vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                  local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node;
      local_188._M_current =
           (stKeyPressData<short> *)
           std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::begin
                     (&in_stack_fffffffffffffd28->
                       super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
      ;
      local_190 = (stKeyPressData<short> *)
                  std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::end
                            (&in_stack_fffffffffffffd28->
                              super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                            );
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                                 *)in_stack_fffffffffffffd30,
                                (__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                                 *)in_stack_fffffffffffffd28), bVar4) {
        local_198 = __gnu_cxx::
                    __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                    ::operator*(&local_188);
        pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](&local_f8,local_198->pos);
        local_178 = (double)(int)*pvVar7 + local_178;
        __gnu_cxx::
        __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
        ::operator++(&local_188);
      }
      sVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                        ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                         local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node);
      auVar15._8_4_ = (int)(sVar8 >> 0x20);
      auVar15._0_8_ = sVar8;
      auVar15._12_4_ = 0x45300000;
      local_178 = local_178 /
                  ((auVar15._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0));
      stKeyPressCollection<short>::stKeyPressCollection
                (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      local_1c0 = local_1b8;
      local_1c8._M_current =
           (stKeyPressData<short> *)
           std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::begin
                     (&in_stack_fffffffffffffd28->
                       super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
      ;
      local_1d0 = (stKeyPressData<short> *)
                  std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::end
                            (&in_stack_fffffffffffffd28->
                              super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                            );
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                                 *)in_stack_fffffffffffffd30,
                                (__normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                                 *)in_stack_fffffffffffffd28), bVar4) {
        local_1d8 = __gnu_cxx::
                    __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                    ::operator*(&local_1c8);
        pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](&local_f8,local_1d8->pos);
        if (local_178 * 0.3 < (double)(int)*pvVar7) {
          std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::push_back
                    ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                     in_stack_fffffffffffffd40,
                     (value_type *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        }
        __gnu_cxx::
        __normal_iterator<stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
        ::operator++(&local_1c8);
      }
      sVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                        ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                         local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node);
      if (sVar8 == local_170) {
        local_1dc = 0xf;
      }
      else {
        local_1dc = 0;
      }
      stKeyPressCollection<short>::~stKeyPressCollection((stKeyPressCollection<short> *)0x1bd7b8);
    } while (local_1dc == 0);
  }
  sVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                    ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                     local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  if (1 < sVar8) {
    __a = &local_200;
    stKeyPressCollection<short>::stKeyPressCollection(in_stack_fffffffffffffd30);
    std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::front
              (&in_stack_fffffffffffffd30->
                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>);
    std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::push_back
              ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
               in_stack_fffffffffffffd40,
               (value_type *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    local_204 = 1;
    while (iVar6 = local_204,
          sVar8 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                            ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                              *)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_node), iVar6 < (int)sVar8) {
      pvVar12 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                operator[]((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *
                           )local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node,(long)local_204);
      in_stack_fffffffffffffd40 = (allocator_type *)pvVar12->pos;
      pvVar12 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::back
                          (&in_stack_fffffffffffffd30->
                            super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          );
      if ((long)(int)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                     super__Deque_impl_data._M_start._M_node <
          (long)in_stack_fffffffffffffd40 - pvVar12->pos) {
LAB_001bd8f4:
        std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                  ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                   local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node,(long)local_204);
        std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::push_back
                  ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                   in_stack_fffffffffffffd40,
                   (value_type *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      }
      else {
        this = (stKeyPressCollection<short> *)
               local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first;
        pvVar12 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                  operator[]((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                              *)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_node,(long)local_204);
        pvVar7 = std::vector<short,_std::allocator<short>_>::operator[]
                           ((vector<short,_std::allocator<short>_> *)this,pvVar12->pos);
        in_stack_fffffffffffffd3c = (int)*pvVar7;
        in_stack_fffffffffffffd30 =
             (stKeyPressCollection<short> *)
             local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_first;
        pvVar12 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::back
                            ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                              *)local_58.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_first);
        pvVar7 = std::vector<short,_std::allocator<short>_>::operator[]
                           ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffd30,
                            pvVar12->pos);
        if (*pvVar7 < in_stack_fffffffffffffd3c) goto LAB_001bd8f4;
      }
      local_204 = local_204 + 1;
    }
    std::swap<stKeyPressCollection<short>>
              (__a,(stKeyPressCollection<short> *)CONCAT44(iVar6,in_stack_fffffffffffffd48));
    stKeyPressCollection<short>::~stKeyPressCollection((stKeyPressCollection<short> *)0x1bd97a);
  }
  local_1dc = 1;
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffd40);
  std::deque<long,_std::allocator<long>_>::~deque(in_stack_fffffffffffffd80);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40);
  return true;
}

Assistant:

bool findKeyPresses(
        const TWaveformViewT<T> & waveform,
        TKeyPressCollectionT<T> & res,
        TWaveformT<T> & waveformThreshold,
        TWaveformT<T> & waveformMax,
        double thresholdBackground,
        int historySize,
        int historySizeReset,
        bool removeLowPower) {
    res.clear();
    waveformThreshold.resize(waveform.n);
    waveformMax.resize(waveform.n);

    int rbBegin = 0;
    double rbAverage = 0.0;
    std::vector<double> rbSamples(8*historySize, 0.0);

    int k = historySize;
    std::deque<int64_t> que(k);

    auto samples = waveform.samples;
    auto n       = waveform.n;

    TWaveformT<T> waveformAbs(n);
    for (int64_t i = 0; i < n; ++i) {
        waveformAbs[i] = std::abs(samples[i]);
    }

    for (int64_t i = 0; i < n; ++i) {
        {
            int64_t ii = i - k/2;
            if (ii >= 0) {
                rbAverage *= rbSamples.size();
                rbAverage -= rbSamples[rbBegin];
                double acur = waveformAbs[i];
                rbSamples[rbBegin] = acur;
                rbAverage += acur;
                rbAverage /= rbSamples.size();
                if (++rbBegin >= (int) rbSamples.size()) {
                    rbBegin = 0;
                }
            }
        }

        if (i < k) {
            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }
            que.push_back(i);
        } else {
            while((!que.empty()) && que.front() <= i - k) {
                que.pop_front();
            }

            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }

            que.push_back(i);

            int64_t itest = i - k/2;
            if (itest >= 2*k && itest < n - 2*k && que.front() == itest) {
                double acur = waveformAbs[itest];
                if (acur > thresholdBackground*rbAverage) {
                    res.emplace_back(TKeyPressDataT<T> { std::move(waveform), itest, 0.0, -1, -1, '?' });
                }
            }
            waveformThreshold[itest] = thresholdBackground*rbAverage;
            waveformMax[itest] = waveformAbs[que.front()];
        }
    }

    if (removeLowPower) {
        while (true) {
            auto oldn = res.size();

            double avgPower = 0.0;
            for (const auto & kp : res) {
                avgPower += waveformAbs[kp.pos];
            }
            avgPower /= res.size();

            auto tmp = std::move(res);
            for (const auto & kp : tmp) {
                if (waveformAbs[kp.pos] > 0.3*avgPower) {
                    res.push_back(kp);
                }
            }

            if (res.size() == oldn) break;
        }
    }

    if (res.size() > 1) {
        TKeyPressCollectionT<T> res2;
        res2.push_back(res.front());

        for (int i = 1; i < (int) res.size(); ++i) {
            if (res[i].pos - res2.back().pos > historySizeReset || waveformMax[res[i].pos] > waveformMax[res2.back().pos]) {
                res2.push_back(res[i]);
            }
        }

        std::swap(res, res2);
    }

    return true;
}